

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O2

bool TasGrid::IO::readFlag<TasGrid::IO::mode_ascii_type>(istream *os)

{
  int flag;
  int local_c;
  
  ::std::istream::operator>>((istream *)os,&local_c);
  return local_c != 0;
}

Assistant:

bool readFlag(std::istream &os){
    if (std::is_same<iomode, mode_ascii_type>::value){
        int flag;
        os >> flag;
        return (flag != 0);
    }else{
        char cflag;
        os.read(&cflag, sizeof(char));
        return (cflag == 'y');
    }
}